

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# celf.h
# Opt level: O1

vector<unsigned_long,_std::allocator<unsigned_long>_> *
CELF::celfalgo(vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
              Graph *graph,double budget,vector<double,_std::allocator<double>_> *budget_list,
              CascadeModel model)

{
  double dVar1;
  vector<double,_std::allocator<double>_> *pvVar2;
  _Elt_pointer ptVar3;
  _Elt_pointer ptVar4;
  _Elt_pointer ptVar5;
  _Elt_pointer ptVar6;
  _Elt_pointer ptVar7;
  _Elt_pointer ptVar8;
  _Map_pointer pptVar9;
  value_type_conflict2 *__val;
  clock_t cVar10;
  clock_t cVar11;
  ostream *poVar12;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  _Map_pointer pptVar17;
  vector<unsigned_long,_std::allocator<unsigned_long>_> S_CB;
  vector<unsigned_long,_std::allocator<unsigned_long>_> S_UC;
  tuple<unsigned_long,_double,_double,_unsigned_long> u;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vecSeed;
  deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
  Q_CB;
  deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
  Q_UC;
  double local_220;
  double local_218;
  double local_208;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1d8;
  double local_1c0;
  tuple<unsigned_long,_double,_double,_unsigned_long> local_1b8;
  unsigned_long local_198;
  double dStack_190;
  double local_188;
  unsigned_long uStack_180;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_178;
  _Elt_pointer local_158;
  vector<double,_std::allocator<double>_> *local_150;
  _Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
  local_148;
  _Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
  local_f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_a0;
  _Elt_pointer local_98;
  _Elt_pointer local_90;
  _Elt_pointer local_88;
  _Map_pointer local_80;
  _Elt_pointer local_78;
  _Elt_pointer local_70;
  _Elt_pointer local_68;
  _Map_pointer local_60;
  _Elt_pointer local_58;
  _Elt_pointer local_50;
  _Elt_pointer local_48;
  _Map_pointer local_40;
  _Elt_pointer local_38;
  
  local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_1c0 = budget;
  local_a0 = __return_storage_ptr__;
  std::
  _Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
  ::_M_initialize_map(&local_f8,0);
  local_148._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_148._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_148._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_148._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_148._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_148._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_148._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_148._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_148._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_148._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
  ::_M_initialize_map(&local_148,0);
  local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(8);
  local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  *local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_150 = budget_list;
  cVar10 = clock();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Initial deque start",0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  pvVar2 = local_150;
  if ((graph->
      super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (graph->
      super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    pptVar17 = (_Map_pointer)0x0;
    do {
      *local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start = (unsigned_long)pptVar17;
      dVar1 = GraphBase::inf_eval(graph,&local_178,model,10000);
      local_1b8.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
      super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
      super__Tuple_impl<2UL,_double,_unsigned_long>.super__Head_base<2UL,_double,_false>.
      _M_head_impl = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[(long)pptVar17];
      local_1b8.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
      super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
      super__Tuple_impl<2UL,_double,_unsigned_long>.super__Tuple_impl<3UL,_unsigned_long>.
      super__Head_base<3UL,_unsigned_long,_false>._M_head_impl =
           (_Head_base<3UL,_unsigned_long,_false>)0;
      local_1b8.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
      super__Tuple_impl<1UL,_double,_double,_unsigned_long>.super__Head_base<1UL,_double,_false>.
      _M_head_impl = dVar1;
      local_1b8.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
      super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = (unsigned_long)pptVar17;
      std::
      deque<std::tuple<unsigned_long,double,double,unsigned_long>,std::allocator<std::tuple<unsigned_long,double,double,unsigned_long>>>
      ::emplace_back<std::tuple<unsigned_long,double,double,unsigned_long>>
                ((deque<std::tuple<unsigned_long,double,double,unsigned_long>,std::allocator<std::tuple<unsigned_long,double,double,unsigned_long>>>
                  *)&local_f8,&local_1b8);
      local_1b8.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
      super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
      super__Tuple_impl<2UL,_double,_unsigned_long>.super__Head_base<2UL,_double,_false>.
      _M_head_impl = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[(long)pptVar17];
      local_1b8.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
      super__Tuple_impl<1UL,_double,_double,_unsigned_long>.super__Head_base<1UL,_double,_false>.
      _M_head_impl = dVar1 / local_1b8.
                             super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
                             super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
                             super__Tuple_impl<2UL,_double,_unsigned_long>.
                             super__Head_base<2UL,_double,_false>._M_head_impl;
      local_1b8.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
      super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
      super__Tuple_impl<2UL,_double,_unsigned_long>.super__Tuple_impl<3UL,_unsigned_long>.
      super__Head_base<3UL,_unsigned_long,_false>._M_head_impl =
           (_Head_base<3UL,_unsigned_long,_false>)0;
      local_1b8.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
      super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = (unsigned_long)pptVar17;
      std::
      deque<std::tuple<unsigned_long,double,double,unsigned_long>,std::allocator<std::tuple<unsigned_long,double,double,unsigned_long>>>
      ::emplace_back<std::tuple<unsigned_long,double,double,unsigned_long>>
                ((deque<std::tuple<unsigned_long,double,double,unsigned_long>,std::allocator<std::tuple<unsigned_long,double,double,unsigned_long>>>
                  *)&local_148,&local_1b8);
      pptVar17 = (_Map_pointer)((long)pptVar17 + 1);
    } while (pptVar17 <
             (_Map_pointer)
             (((long)(graph->
                     super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(graph->
                     super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Initial deque end",0x11)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  cVar11 = clock();
  poVar12 = std::ostream::_M_insert<double>((double)((cVar11 - cVar10) / 1000000));
  std::__ostream_insert<char,std::char_traits<char>>(poVar12," s",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
  std::ostream::put((char)poVar12);
  std::ostream::flush();
  pptVar9 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_node;
  ptVar8 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_last;
  ptVar7 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_first;
  ptVar6 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  pptVar17 = local_f8._M_impl.super__Deque_impl_data._M_start._M_node;
  ptVar5 = local_f8._M_impl.super__Deque_impl_data._M_start._M_last;
  ptVar4 = local_f8._M_impl.super__Deque_impl_data._M_start._M_first;
  ptVar3 = local_f8._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (local_f8._M_impl.super__Deque_impl_data._M_start._M_cur !=
      local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    local_1b8.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
    super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
    super__Tuple_impl<2UL,_double,_unsigned_long>.super__Tuple_impl<3UL,_unsigned_long>.
    super__Head_base<3UL,_unsigned_long,_false>._M_head_impl =
         (_Head_base<3UL,_unsigned_long,_false>)
         (_Head_base<3UL,_unsigned_long,_false>)
         local_f8._M_impl.super__Deque_impl_data._M_start._M_cur;
    local_1b8.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
    super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
    super__Tuple_impl<2UL,_double,_unsigned_long>.super__Head_base<2UL,_double,_false>._M_head_impl
         = (double)local_f8._M_impl.super__Deque_impl_data._M_start._M_first;
    local_1b8.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
    super__Tuple_impl<1UL,_double,_double,_unsigned_long>.super__Head_base<1UL,_double,_false>.
    _M_head_impl = (double)local_f8._M_impl.super__Deque_impl_data._M_start._M_last;
    local_1b8.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
    super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
         (unsigned_long)local_f8._M_impl.super__Deque_impl_data._M_start._M_node;
    local_58 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur;
    local_50 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_first;
    local_48 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_last;
    local_40 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_node;
    uVar15 = ((long)local_f8._M_impl.super__Deque_impl_data._M_start._M_last -
              (long)local_f8._M_impl.super__Deque_impl_data._M_start._M_cur >> 5) +
             ((long)local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)local_f8._M_impl.super__Deque_impl_data._M_finish._M_first >> 5) +
             ((((ulong)((long)local_f8._M_impl.super__Deque_impl_data._M_finish._M_node -
                       (long)local_f8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
             (ulong)(local_f8._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)
             ) * 0x10;
    lVar14 = 0x3f;
    if (uVar15 != 0) {
      for (; uVar15 >> lVar14 == 0; lVar14 = lVar14 + -1) {
      }
    }
    std::
    __introsort_loop<std::_Deque_iterator<std::tuple<unsigned_long,double,double,unsigned_long>,std::tuple<unsigned_long,double,double,unsigned_long>&,std::tuple<unsigned_long,double,double,unsigned_long>*>,long,__gnu_cxx::__ops::_Iter_comp_iter<CELF::celfalgo(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,CascadeModel)::_lambda(auto:1&,auto:2&)_1_>>
              (&local_1b8,&local_58,((uint)lVar14 ^ 0x3f) * 2 ^ 0x7e);
    local_78 = ptVar3;
    local_70 = ptVar4;
    local_68 = ptVar5;
    local_60 = pptVar17;
    local_98 = ptVar6;
    local_90 = ptVar7;
    local_88 = ptVar8;
    local_80 = pptVar9;
    std::
    __final_insertion_sort<std::_Deque_iterator<std::tuple<unsigned_long,double,double,unsigned_long>,std::tuple<unsigned_long,double,double,unsigned_long>&,std::tuple<unsigned_long,double,double,unsigned_long>*>,__gnu_cxx::__ops::_Iter_comp_iter<CELF::celfalgo(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,CascadeModel)::_lambda(auto:1&,auto:2&)_1_>>
              ();
  }
  pptVar9 = local_148._M_impl.super__Deque_impl_data._M_finish._M_node;
  ptVar8 = local_148._M_impl.super__Deque_impl_data._M_finish._M_last;
  ptVar7 = local_148._M_impl.super__Deque_impl_data._M_finish._M_first;
  ptVar6 = local_148._M_impl.super__Deque_impl_data._M_finish._M_cur;
  pptVar17 = local_148._M_impl.super__Deque_impl_data._M_start._M_node;
  ptVar5 = local_148._M_impl.super__Deque_impl_data._M_start._M_last;
  ptVar4 = local_148._M_impl.super__Deque_impl_data._M_start._M_first;
  ptVar3 = local_148._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (local_148._M_impl.super__Deque_impl_data._M_start._M_cur !=
      local_148._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    local_1b8.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
    super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
    super__Tuple_impl<2UL,_double,_unsigned_long>.super__Tuple_impl<3UL,_unsigned_long>.
    super__Head_base<3UL,_unsigned_long,_false>._M_head_impl =
         (_Head_base<3UL,_unsigned_long,_false>)
         (_Head_base<3UL,_unsigned_long,_false>)
         local_148._M_impl.super__Deque_impl_data._M_start._M_cur;
    local_1b8.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
    super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
    super__Tuple_impl<2UL,_double,_unsigned_long>.super__Head_base<2UL,_double,_false>._M_head_impl
         = (double)local_148._M_impl.super__Deque_impl_data._M_start._M_first;
    local_1b8.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
    super__Tuple_impl<1UL,_double,_double,_unsigned_long>.super__Head_base<1UL,_double,_false>.
    _M_head_impl = (double)local_148._M_impl.super__Deque_impl_data._M_start._M_last;
    local_1b8.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
    super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
         (unsigned_long)local_148._M_impl.super__Deque_impl_data._M_start._M_node;
    local_58 = local_148._M_impl.super__Deque_impl_data._M_finish._M_cur;
    local_50 = local_148._M_impl.super__Deque_impl_data._M_finish._M_first;
    local_48 = local_148._M_impl.super__Deque_impl_data._M_finish._M_last;
    local_40 = local_148._M_impl.super__Deque_impl_data._M_finish._M_node;
    uVar15 = ((long)local_148._M_impl.super__Deque_impl_data._M_start._M_last -
              (long)local_148._M_impl.super__Deque_impl_data._M_start._M_cur >> 5) +
             ((long)local_148._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)local_148._M_impl.super__Deque_impl_data._M_finish._M_first >> 5) +
             ((((ulong)((long)local_148._M_impl.super__Deque_impl_data._M_finish._M_node -
                       (long)local_148._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
             (ulong)(local_148._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0
                    )) * 0x10;
    lVar14 = 0x3f;
    if (uVar15 != 0) {
      for (; uVar15 >> lVar14 == 0; lVar14 = lVar14 + -1) {
      }
    }
    std::
    __introsort_loop<std::_Deque_iterator<std::tuple<unsigned_long,double,double,unsigned_long>,std::tuple<unsigned_long,double,double,unsigned_long>&,std::tuple<unsigned_long,double,double,unsigned_long>*>,long,__gnu_cxx::__ops::_Iter_comp_iter<CELF::celfalgo(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,CascadeModel)::_lambda(auto:1&,auto:2&)_2_>>
              (&local_1b8,&local_58,((uint)lVar14 ^ 0x3f) * 2 ^ 0x7e);
    local_78 = ptVar3;
    local_70 = ptVar4;
    local_68 = ptVar5;
    local_60 = pptVar17;
    local_98 = ptVar6;
    local_90 = ptVar7;
    local_88 = ptVar8;
    local_80 = pptVar9;
    std::
    __final_insertion_sort<std::_Deque_iterator<std::tuple<unsigned_long,double,double,unsigned_long>,std::tuple<unsigned_long,double,double,unsigned_long>&,std::tuple<unsigned_long,double,double,unsigned_long>*>,__gnu_cxx::__ops::_Iter_comp_iter<CELF::celfalgo(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,CascadeModel)::_lambda(auto:1&,auto:2&)_2_>>
              ();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Start UC",8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  local_218 = 0.0;
  if (0.0 < local_1c0) {
    local_218 = 0.0;
    local_220 = 0.0;
LAB_0011a607:
    do {
      if (local_1c0 <
          ((local_f8._M_impl.super__Deque_impl_data._M_start._M_cur)->
          super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>).
          super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
          super__Tuple_impl<2UL,_double,_unsigned_long>.super__Head_base<2UL,_double,_false>.
          _M_head_impl + local_220) {
        if (local_f8._M_impl.super__Deque_impl_data._M_start._M_cur ==
            local_f8._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
          operator_delete(local_f8._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
          local_f8._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_f8._M_impl.super__Deque_impl_data._M_start._M_node[1];
          local_f8._M_impl.super__Deque_impl_data._M_start._M_last =
               local_f8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x10;
          local_f8._M_impl.super__Deque_impl_data._M_start._M_first =
               local_f8._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_f8._M_impl.super__Deque_impl_data._M_start._M_node =
               local_f8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
        }
        else {
          local_f8._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_f8._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
        }
        if (local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
            local_f8._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_0011a607;
      }
      if (local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_f8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
      local_198 = ((local_f8._M_impl.super__Deque_impl_data._M_start._M_cur)->
                  super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>).
                  super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
                  super__Tuple_impl<2UL,_double,_unsigned_long>.
                  super__Tuple_impl<3UL,_unsigned_long>.super__Head_base<3UL,_unsigned_long,_false>.
                  _M_head_impl;
      dStack_190 = ((local_f8._M_impl.super__Deque_impl_data._M_start._M_cur)->
                   super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>).
                   super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
                   super__Tuple_impl<2UL,_double,_unsigned_long>.
                   super__Head_base<2UL,_double,_false>._M_head_impl;
      local_188 = ((local_f8._M_impl.super__Deque_impl_data._M_start._M_cur)->
                  super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>).
                  super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
                  super__Head_base<1UL,_double,_false>._M_head_impl;
      uStack_180 = ((local_f8._M_impl.super__Deque_impl_data._M_start._M_cur)->
                   super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>).
                   super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
      if (local_198 ==
          (long)local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3) {
        if (local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_1d8,
                     (iterator)
                     local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&uStack_180);
        }
        else {
          *local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = uStack_180;
          local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        if (local_f8._M_impl.super__Deque_impl_data._M_start._M_cur ==
            local_f8._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
          operator_delete(local_f8._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
          local_f8._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_f8._M_impl.super__Deque_impl_data._M_start._M_node[1];
          local_f8._M_impl.super__Deque_impl_data._M_start._M_last =
               local_f8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x10;
          local_f8._M_impl.super__Deque_impl_data._M_start._M_first =
               local_f8._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_f8._M_impl.super__Deque_impl_data._M_start._M_node =
               local_f8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
        }
        else {
          local_f8._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_f8._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
        }
        local_220 = local_220 + dStack_190;
        local_218 = GraphBase::inf_eval(graph,&local_1d8,model,10000);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"UC push new seed: ",0x12);
        poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
        poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
        if ((long)local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start == 0) {
          dVar1 = 0.0;
        }
        else {
          lVar14 = (long)local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3;
          dVar1 = 0.0;
          lVar16 = 0;
          do {
            dVar1 = dVar1 + (local_150->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                            .super__Vector_impl_data._M_start
                            [local_1d8.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start[lVar16]];
            lVar16 = lVar16 + 1;
          } while (lVar14 + (ulong)(lVar14 == 0) != lVar16);
        }
        poVar12 = std::ostream::_M_insert<double>(dVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
        poVar12 = std::ostream::_M_insert<double>(local_218);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
        std::ostream::put((char)poVar12);
        std::ostream::flush();
      }
      else {
        if (local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_1d8,
                     (iterator)
                     local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&uStack_180);
        }
        else {
          *local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = uStack_180;
          local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        dVar1 = GraphBase::inf_eval(graph,&local_1d8,model,10000);
        pptVar9 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_node;
        ptVar7 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_last;
        ptVar6 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_first;
        ptVar5 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        pptVar17 = local_f8._M_impl.super__Deque_impl_data._M_start._M_node;
        ptVar4 = local_f8._M_impl.super__Deque_impl_data._M_start._M_last;
        ptVar3 = local_f8._M_impl.super__Deque_impl_data._M_start._M_cur;
        ((_Head_base<1UL,_double,_false> *)
        ((long)local_f8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x10))->_M_head_impl =
             dVar1 - local_218;
        local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
        *(long *)local_f8._M_impl.super__Deque_impl_data._M_start._M_cur =
             (long)local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3;
        if (local_f8._M_impl.super__Deque_impl_data._M_start._M_cur !=
            local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur) {
          local_1b8.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
          super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
          super__Tuple_impl<2UL,_double,_unsigned_long>.super__Tuple_impl<3UL,_unsigned_long>.
          super__Head_base<3UL,_unsigned_long,_false>._M_head_impl =
               (_Head_base<3UL,_unsigned_long,_false>)
               (_Head_base<3UL,_unsigned_long,_false>)
               local_f8._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_158 = local_f8._M_impl.super__Deque_impl_data._M_start._M_first;
          local_1b8.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
          super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
          super__Tuple_impl<2UL,_double,_unsigned_long>.super__Head_base<2UL,_double,_false>.
          _M_head_impl = (double)local_f8._M_impl.super__Deque_impl_data._M_start._M_first;
          local_1b8.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
          super__Tuple_impl<1UL,_double,_double,_unsigned_long>.super__Head_base<1UL,_double,_false>
          ._M_head_impl = (double)local_f8._M_impl.super__Deque_impl_data._M_start._M_last;
          local_1b8.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
          super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
               (unsigned_long)local_f8._M_impl.super__Deque_impl_data._M_start._M_node;
          local_58 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          local_50 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_first;
          local_48 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_last;
          local_40 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_node;
          uVar15 = ((long)local_f8._M_impl.super__Deque_impl_data._M_start._M_last -
                    (long)local_f8._M_impl.super__Deque_impl_data._M_start._M_cur >> 5) +
                   ((long)local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur -
                    (long)local_f8._M_impl.super__Deque_impl_data._M_finish._M_first >> 5) +
                   ((((ulong)((long)local_f8._M_impl.super__Deque_impl_data._M_finish._M_node -
                             (long)local_f8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) -
                    1) + (ulong)(local_f8._M_impl.super__Deque_impl_data._M_finish._M_node ==
                                (_Map_pointer)0x0)) * 0x10;
          lVar14 = 0x3f;
          if (uVar15 != 0) {
            for (; uVar15 >> lVar14 == 0; lVar14 = lVar14 + -1) {
            }
          }
          std::
          __introsort_loop<std::_Deque_iterator<std::tuple<unsigned_long,double,double,unsigned_long>,std::tuple<unsigned_long,double,double,unsigned_long>&,std::tuple<unsigned_long,double,double,unsigned_long>*>,long,__gnu_cxx::__ops::_Iter_comp_iter<CELF::celfalgo(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,CascadeModel)::_lambda(auto:1&,auto:2&)_3_>>
                    (&local_1b8,&local_58,((uint)lVar14 ^ 0x3f) * 2 ^ 0x7e);
          local_78 = ptVar3;
          local_70 = local_158;
          local_68 = ptVar4;
          local_60 = pptVar17;
          local_98 = ptVar5;
          local_90 = ptVar6;
          local_88 = ptVar7;
          local_80 = pptVar9;
          std::
          __final_insertion_sort<std::_Deque_iterator<std::tuple<unsigned_long,double,double,unsigned_long>,std::tuple<unsigned_long,double,double,unsigned_long>&,std::tuple<unsigned_long,double,double,unsigned_long>*>,__gnu_cxx::__ops::_Iter_comp_iter<CELF::celfalgo(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,CascadeModel)::_lambda(auto:1&,auto:2&)_3_>>
                    (&local_78,&local_98);
        }
      }
    } while (local_220 < local_1c0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"End UC",6);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Start CB",8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  local_208 = 0.0;
  if (0.0 < local_1c0) {
    local_208 = 0.0;
    local_220 = 0.0;
LAB_0011ab36:
    do {
      if (local_1c0 <
          ((local_148._M_impl.super__Deque_impl_data._M_start._M_cur)->
          super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>).
          super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
          super__Tuple_impl<2UL,_double,_unsigned_long>.super__Head_base<2UL,_double,_false>.
          _M_head_impl + local_220) {
        if (local_148._M_impl.super__Deque_impl_data._M_start._M_cur ==
            local_148._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
          operator_delete(local_148._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
          local_148._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_148._M_impl.super__Deque_impl_data._M_start._M_node[1];
          local_148._M_impl.super__Deque_impl_data._M_start._M_last =
               local_148._M_impl.super__Deque_impl_data._M_start._M_cur + 0x10;
          local_148._M_impl.super__Deque_impl_data._M_start._M_first =
               local_148._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_148._M_impl.super__Deque_impl_data._M_start._M_node =
               local_148._M_impl.super__Deque_impl_data._M_start._M_node + 1;
        }
        else {
          local_148._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_148._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
        }
        if (local_148._M_impl.super__Deque_impl_data._M_finish._M_cur !=
            local_148._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_0011ab36;
      }
      if (local_148._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_148._M_impl.super__Deque_impl_data._M_start._M_cur) break;
      local_198 = ((local_148._M_impl.super__Deque_impl_data._M_start._M_cur)->
                  super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>).
                  super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
                  super__Tuple_impl<2UL,_double,_unsigned_long>.
                  super__Tuple_impl<3UL,_unsigned_long>.super__Head_base<3UL,_unsigned_long,_false>.
                  _M_head_impl;
      dStack_190 = ((local_148._M_impl.super__Deque_impl_data._M_start._M_cur)->
                   super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>).
                   super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
                   super__Tuple_impl<2UL,_double,_unsigned_long>.
                   super__Head_base<2UL,_double,_false>._M_head_impl;
      local_188 = ((local_148._M_impl.super__Deque_impl_data._M_start._M_cur)->
                  super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>).
                  super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
                  super__Head_base<1UL,_double,_false>._M_head_impl;
      uStack_180 = ((local_148._M_impl.super__Deque_impl_data._M_start._M_cur)->
                   super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>).
                   super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
      if (local_198 ==
          (long)local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3) {
        if (local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_1f8,
                     (iterator)
                     local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&uStack_180);
        }
        else {
          *local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = uStack_180;
          local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        if (local_148._M_impl.super__Deque_impl_data._M_start._M_cur ==
            local_148._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
          operator_delete(local_148._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
          local_148._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_148._M_impl.super__Deque_impl_data._M_start._M_node[1];
          local_148._M_impl.super__Deque_impl_data._M_start._M_last =
               local_148._M_impl.super__Deque_impl_data._M_start._M_cur + 0x10;
          local_148._M_impl.super__Deque_impl_data._M_start._M_first =
               local_148._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_148._M_impl.super__Deque_impl_data._M_start._M_node =
               local_148._M_impl.super__Deque_impl_data._M_start._M_node + 1;
        }
        else {
          local_148._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_148._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
        }
        local_220 = local_220 + dStack_190;
        local_208 = GraphBase::inf_eval(graph,&local_1f8,model,10000);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"CB push new seed: ",0x12);
        poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
        poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
        if ((long)local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start == 0) {
          dVar1 = 0.0;
        }
        else {
          lVar14 = (long)local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3;
          dVar1 = 0.0;
          lVar16 = 0;
          do {
            dVar1 = dVar1 + (local_150->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                            .super__Vector_impl_data._M_start
                            [local_1f8.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start[lVar16]];
            lVar16 = lVar16 + 1;
          } while (lVar14 + (ulong)(lVar14 == 0) != lVar16);
        }
        poVar12 = std::ostream::_M_insert<double>(dVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
        poVar12 = std::ostream::_M_insert<double>(local_208);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
        std::ostream::put((char)poVar12);
        std::ostream::flush();
      }
      else {
        if (local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_1f8,
                     (iterator)
                     local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&uStack_180);
        }
        else {
          *local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = uStack_180;
          local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        dVar1 = GraphBase::inf_eval(graph,&local_1f8,model,10000);
        pptVar9 = local_148._M_impl.super__Deque_impl_data._M_finish._M_node;
        ptVar6 = local_148._M_impl.super__Deque_impl_data._M_finish._M_first;
        ptVar5 = local_148._M_impl.super__Deque_impl_data._M_finish._M_cur;
        pptVar17 = local_148._M_impl.super__Deque_impl_data._M_start._M_node;
        ptVar4 = local_148._M_impl.super__Deque_impl_data._M_start._M_last;
        ptVar3 = local_148._M_impl.super__Deque_impl_data._M_start._M_cur;
        ((_Head_base<1UL,_double,_false> *)
        ((long)local_148._M_impl.super__Deque_impl_data._M_start._M_cur + 0x10))->_M_head_impl =
             (dVar1 - local_208) / dStack_190;
        local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
        *(long *)local_148._M_impl.super__Deque_impl_data._M_start._M_cur =
             (long)local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3;
        if (local_148._M_impl.super__Deque_impl_data._M_start._M_cur !=
            local_148._M_impl.super__Deque_impl_data._M_finish._M_cur) {
          local_1b8.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
          super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
          super__Tuple_impl<2UL,_double,_unsigned_long>.super__Tuple_impl<3UL,_unsigned_long>.
          super__Head_base<3UL,_unsigned_long,_false>._M_head_impl =
               (_Head_base<3UL,_unsigned_long,_false>)
               (_Head_base<3UL,_unsigned_long,_false>)
               local_148._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_38 = local_148._M_impl.super__Deque_impl_data._M_start._M_first;
          local_1b8.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
          super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
          super__Tuple_impl<2UL,_double,_unsigned_long>.super__Head_base<2UL,_double,_false>.
          _M_head_impl = (double)local_148._M_impl.super__Deque_impl_data._M_start._M_first;
          local_1b8.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
          super__Tuple_impl<1UL,_double,_double,_unsigned_long>.super__Head_base<1UL,_double,_false>
          ._M_head_impl = (double)local_148._M_impl.super__Deque_impl_data._M_start._M_last;
          local_1b8.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
          super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
               (unsigned_long)local_148._M_impl.super__Deque_impl_data._M_start._M_node;
          local_58 = local_148._M_impl.super__Deque_impl_data._M_finish._M_cur;
          local_50 = local_148._M_impl.super__Deque_impl_data._M_finish._M_first;
          local_158 = local_148._M_impl.super__Deque_impl_data._M_finish._M_last;
          local_48 = local_148._M_impl.super__Deque_impl_data._M_finish._M_last;
          local_40 = local_148._M_impl.super__Deque_impl_data._M_finish._M_node;
          uVar15 = ((long)local_148._M_impl.super__Deque_impl_data._M_start._M_last -
                    (long)local_148._M_impl.super__Deque_impl_data._M_start._M_cur >> 5) +
                   ((long)local_148._M_impl.super__Deque_impl_data._M_finish._M_cur -
                    (long)local_148._M_impl.super__Deque_impl_data._M_finish._M_first >> 5) +
                   ((((ulong)((long)local_148._M_impl.super__Deque_impl_data._M_finish._M_node -
                             (long)local_148._M_impl.super__Deque_impl_data._M_start._M_node) >> 3)
                    - 1) + (ulong)(local_148._M_impl.super__Deque_impl_data._M_finish._M_node ==
                                  (_Map_pointer)0x0)) * 0x10;
          lVar14 = 0x3f;
          if (uVar15 != 0) {
            for (; uVar15 >> lVar14 == 0; lVar14 = lVar14 + -1) {
            }
          }
          std::
          __introsort_loop<std::_Deque_iterator<std::tuple<unsigned_long,double,double,unsigned_long>,std::tuple<unsigned_long,double,double,unsigned_long>&,std::tuple<unsigned_long,double,double,unsigned_long>*>,long,__gnu_cxx::__ops::_Iter_comp_iter<CELF::celfalgo(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,CascadeModel)::_lambda(auto:1&,auto:2&)_4_>>
                    (&local_1b8,&local_58,((uint)lVar14 ^ 0x3f) * 2 ^ 0x7e);
          local_78 = ptVar3;
          local_70 = local_38;
          local_68 = ptVar4;
          local_60 = pptVar17;
          local_98 = ptVar5;
          local_90 = ptVar6;
          local_88 = local_158;
          local_80 = pptVar9;
          std::
          __final_insertion_sort<std::_Deque_iterator<std::tuple<unsigned_long,double,double,unsigned_long>,std::tuple<unsigned_long,double,double,unsigned_long>&,std::tuple<unsigned_long,double,double,unsigned_long>*>,__gnu_cxx::__ops::_Iter_comp_iter<CELF::celfalgo(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,CascadeModel)::_lambda(auto:1&,auto:2&)_4_>>
                    (&local_78,&local_98);
        }
      }
    } while (local_220 < local_1c0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"CB end",6);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  if (local_208 <= local_218) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"UC_inf: ",8);
    poVar12 = std::ostream::_M_insert<double>(local_218);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    pvVar13 = &local_1d8;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"CB_inf: ",8);
    poVar12 = std::ostream::_M_insert<double>(local_208);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    pvVar13 = &local_1f8;
  }
  (local_a0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start =
       (pvVar13->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (local_a0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_finish =
       (pvVar13->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  (local_a0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pvVar13->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (pvVar13->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar13->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar13->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (ulong *)0x0) {
    operator_delete(local_178.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_178.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  _Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
  ::~_Deque_base(&local_148);
  std::
  _Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
  ::~_Deque_base(&local_f8);
  if (local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1f8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1d8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return local_a0;
}

Assistant:

static std::vector<size_t> celfalgo(const Graph& graph, const double budget,
            const std::vector<double> & budget_list, const CascadeModel model) {
        std::vector<size_t> S_UC;
        std::vector<size_t> S_CB;
        std::deque<std::tuple<size_t, double, double, size_t>> Q_UC;  // u u.mg u.cost u.iter
        std::deque<std::tuple<size_t, double, double, size_t>> Q_CB;  // u u.mg/u.cost u.cost u.iter

        std::vector<size_t> vecSeed(1);

        clock_t startTime, endTime;
        startTime = clock();
        std::cout << "Initial deque start" << std::endl;
        for (size_t i = 0; i < graph.size(); i++){
            vecSeed[0] = i;
            double mg = GraphBase::inf_eval(graph, vecSeed, model);
            Q_UC.push_back(std::make_tuple(i, mg, budget_list[i], 0));
            Q_CB.push_back(std::make_tuple(i, mg / budget_list[i], budget_list[i], 0));
        }
        std::cout << "Initial deque end" << std::endl;
        endTime = clock();
        std::cout << double((endTime - startTime) / CLOCKS_PER_SEC) << " s" << std::endl;

        std::sort(Q_UC.begin(), Q_UC.end(), [](auto & left, auto & right) {
            if (std::get<1>(left) == std::get<1>(right)) {
                return std::get<2>(left) < std::get<2>(right);
            }
            else {
                return std::get<1>(left) > std::get<1>(right);
            }
        });

        std::sort(Q_CB.begin(), Q_CB.end(), [](auto & left, auto & right) {
            if (std::get<1>(left) == std::get<1>(right)) {
                return std::get<2>(left) < std::get<2>(right);
            }
            else {
                return std::get<1>(left) > std::get<1>(right);
            }
        });

        std::cout << "Start UC" << std::endl;
        double budget_UC = 0;
        double S_UC_inf = 0;
        while(budget_UC < budget) {
            while(std::get<2>(Q_UC.front()) + budget_UC > budget){  // u u.mg u.cost u.iter
                Q_UC.pop_front();
                if(Q_UC.empty()){
                    break;
                }
            }
            if(Q_UC.empty()){
                break;
            }
            std::tuple<size_t, double, double, size_t> u = Q_UC.front();  // u u.mg u.cost u.iter
            if(std::get<3>(u) == S_UC.size()) {
                S_UC.push_back(std::get<0>(u));
                Q_UC.pop_front();
                budget_UC = budget_UC + std::get<2>(u);
                S_UC_inf = GraphBase::inf_eval(graph, S_UC, model);
                std::cout << "UC push new seed: " << std::get<0>(u) << " " << S_UC.size() << " " <<
                sum_budget(budget_list, S_UC) << " " << S_UC_inf << std::endl;
            }
            else {
                S_UC.push_back(std::get<0>(u));
                std::get<1>(Q_UC.front()) = GraphBase::inf_eval(graph, S_UC, model) - S_UC_inf;
                S_UC.pop_back();
                std::get<3>(Q_UC.front()) = S_UC.size();
                std::sort(Q_UC.begin(), Q_UC.end(), [](auto & left, auto & right) {
                    if (std::get<1>(left) == std::get<1>(right)) {
                        return std::get<2>(left) < std::get<2>(right);
                    }
                    else {
                        return std::get<1>(left) > std::get<1>(right);
                    }
                });
            }
        }
        std::cout << "End UC" << std::endl;

        std::cout << "Start CB" << std::endl;
        double budget_CB = 0;
        double S_CB_inf = 0;
        while(budget_CB < budget) {
            while(std::get<2>(Q_CB.front()) + budget_CB > budget){
                Q_CB.pop_front();
                if(Q_CB.empty()){
                    break;
                }
            }
            if(Q_CB.empty()) {
                break;
            }
            std::tuple<size_t, double, double, size_t> u = Q_CB.front();  // u u.mg/u.cost u.cost u.iter
            if(std::get<3>(u) == S_CB.size()) {
                S_CB.push_back(std::get<0>(u));
                Q_CB.pop_front();
                budget_CB = budget_CB + std::get<2>(u);
                S_CB_inf = GraphBase::inf_eval(graph, S_CB, model);
                std::cout << "CB push new seed: " << std::get<0>(u) << " " << S_CB.size() << " " <<
                sum_budget(budget_list, S_CB) << " " << S_CB_inf << std::endl;
            }
            else {
                S_CB.push_back(std::get<0>(u));
                std::get<1>(Q_CB.front()) = (GraphBase::inf_eval(graph, S_CB, model) - S_CB_inf) / std::get<2>(u);
                S_CB.pop_back();
                std::get<3>(Q_CB.front()) = S_CB.size();
                std::sort(Q_CB.begin(), Q_CB.end(), [](auto & left, auto & right) {
                    if (std::get<1>(left) == std::get<1>(right)) {
                        return std::get<2>(left) < std::get<2>(right);
                    }
                    else {
                        return std::get<1>(left) > std::get<1>(right);
                    }
                });
            }
        }
        std::cout << "CB end" << std::endl;

        if (S_CB_inf > S_UC_inf) {
            std::cout << "CB_inf: " << S_CB_inf << std::endl;
            return S_CB;
        }
        else {
            std::cout << "UC_inf: " << S_UC_inf << std::endl;
            return S_UC;
        }
    }